

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
::create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
          (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,json_array_arg_t *args,semantic_tag *args_1,allocator<char> *args_2)

{
  pointer pbVar1;
  semantic_tag *in_RCX;
  json_array_arg_t *in_RDX;
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *ptr;
  __single_object temp;
  value_type *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffd8;
  
  std::
  make_unique<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
            (in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  pbVar1 = std::
           unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
           ::get((unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                  *)in_RDI);
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffa8);
  std::
  unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 *)in_RDI);
  return pbVar1;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_json_values_.push_back(std::move(temp));
            return ptr;
        }